

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  uint32 *puVar1;
  ulong uVar2;
  bool bVar3;
  Type value;
  long lVar4;
  pointer pUVar5;
  LogMessage *pLVar6;
  int iVar7;
  ulong uVar8;
  byte unaff_BL;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  long lVar12;
  UnknownFieldSet intermediate_unknown_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    pUVar5 = (unknown_fields->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)((long)(unknown_fields->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 4;
    iVar7 = (int)uVar8;
    uVar9 = 0;
    uVar2 = 0;
    if (0 < iVar7) {
      uVar9 = uVar8 & 0xffffffff;
    }
    do {
      uVar8 = uVar2;
      if (uVar9 == uVar8) goto LAB_002aa249;
      puVar1 = &pUVar5->number_;
      pUVar5 = pUVar5 + 1;
      uVar2 = uVar8 + 1;
    } while (*puVar1 != *(uint32 *)(innermost_field + 0x44));
    std::operator+(&local_50,"Option \"",debug_msg_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &intermediate_unknown_fields,&local_50,"\" was already set.");
    unaff_BL = AddNameError(this,(string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&local_50);
LAB_002aa249:
    bVar11 = (long)iVar7 <= (long)uVar8 | unaff_BL;
  }
  else {
    lVar10 = 8;
    lVar12 = 0;
    while( true ) {
      pUVar5 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(int)((ulong)((long)(unknown_fields->fields_).
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5)
                         >> 4);
      bVar11 = lVar4 <= lVar12;
      if (lVar4 <= lVar12) break;
      if (*(int *)((long)pUVar5 + lVar10 + -8) ==
          *(int *)(*intermediate_fields_iter._M_current + 0x44)) {
        value = FieldDescriptor::type(*intermediate_fields_iter._M_current);
        if (value == TYPE_GROUP) {
          if (*(int *)((long)pUVar5 + lVar10 + -4) == 4) {
            bVar3 = ExamineIfOptionIsSet
                              (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                               intermediate_fields_end,innermost_field,debug_msg_name,
                               *(UnknownFieldSet **)((long)&pUVar5->number_ + lVar10));
            if (!bVar3) break;
          }
        }
        else {
          if (value != TYPE_MESSAGE) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&intermediate_unknown_fields,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1a2f);
            pLVar6 = internal::LogMessage::operator<<
                               ((LogMessage *)&intermediate_unknown_fields,
                                "Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar6 = internal::LogMessage::operator<<(pLVar6,value);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar6);
            internal::LogMessage::~LogMessage((LogMessage *)&intermediate_unknown_fields);
LAB_002aa2a3:
            bVar11 = 0;
            break;
          }
          if (*(int *)((long)pUVar5 + lVar10 + -4) == 3) {
            intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar3 = UnknownFieldSet::ParseFromString
                              (&intermediate_unknown_fields,
                               *(string **)((long)&pUVar5->number_ + lVar10));
            if (bVar3) {
              bVar3 = ExamineIfOptionIsSet
                                (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                 intermediate_fields_end,innermost_field,debug_msg_name,
                                 &intermediate_unknown_fields);
              if (!bVar3) {
                UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
                goto LAB_002aa2a3;
              }
            }
            UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
          }
        }
      }
      lVar12 = lVar12 + 1;
      lVar10 = lVar10 + 0x10;
    }
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}